

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdLogic.cpp
# Opt level: O0

Object * __thiscall CmdLogic::execute(CmdLogic *this,Engine *engine)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  undefined4 extraout_var;
  Object *object;
  undefined4 extraout_var_00;
  Object *object_00;
  ObjectBool *pOVar7;
  runtime_error *prVar8;
  int x2;
  int x1;
  ObjectType type2;
  ObjectType type1;
  Object *object2;
  Object *object1;
  Engine *engine_local;
  CmdLogic *this_local;
  
  iVar3 = (**this->left->_vptr_ICommand)(this->left,engine);
  object = getPureObject((Object *)CONCAT44(extraout_var,iVar3));
  iVar3 = (**this->right->_vptr_ICommand)();
  object_00 = getPureObject((Object *)CONCAT44(extraout_var_00,iVar3));
  uVar4 = (**object->_vptr_Object)();
  uVar5 = (**object_00->_vptr_Object)();
  if (this->operation == EQUALS) {
    if ((uVar4 & 0xff) != (uVar5 & 0xff)) {
      pOVar7 = (ObjectBool *)operator_new(0x10);
      ObjectBool::ObjectBool(pOVar7,false);
      return &pOVar7->super_Object;
    }
    if ((uVar4 & 0xff) == 0) {
      pOVar7 = (ObjectBool *)operator_new(0x10);
      iVar3 = getIntOrCrash(object);
      iVar6 = getIntOrCrash(object_00);
      ObjectBool::ObjectBool(pOVar7,iVar3 == iVar6);
      return &pOVar7->super_Object;
    }
    if ((uVar4 & 0xff) == 1) {
      pOVar7 = (ObjectBool *)operator_new(0x10);
      bVar1 = getBoolOrCrash(object);
      bVar2 = getBoolOrCrash(object_00);
      ObjectBool::ObjectBool(pOVar7,bVar1 == bVar2);
      return &pOVar7->super_Object;
    }
  }
  else if (this->operation == NOTEQUALS) {
    if ((uVar4 & 0xff) != (uVar5 & 0xff)) {
      pOVar7 = (ObjectBool *)operator_new(0x10);
      ObjectBool::ObjectBool(pOVar7,true);
      return &pOVar7->super_Object;
    }
    if ((uVar4 & 0xff) == 0) {
      pOVar7 = (ObjectBool *)operator_new(0x10);
      iVar3 = getIntOrCrash(object);
      iVar6 = getIntOrCrash(object_00);
      ObjectBool::ObjectBool(pOVar7,iVar3 != iVar6);
      return &pOVar7->super_Object;
    }
    if ((uVar4 & 0xff) == 1) {
      pOVar7 = (ObjectBool *)operator_new(0x10);
      bVar1 = getBoolOrCrash(object);
      bVar2 = getBoolOrCrash(object_00);
      ObjectBool::ObjectBool(pOVar7,bVar1 != bVar2);
      return &pOVar7->super_Object;
    }
  }
  if (((char)uVar4 == '\0') && ((char)uVar5 == '\0')) {
    iVar3 = getIntOrCrash(object);
    iVar6 = getIntOrCrash(object_00);
    switch(this->operation) {
    case LESSER:
      this_local = (CmdLogic *)operator_new(0x10);
      ObjectBool::ObjectBool((ObjectBool *)this_local,iVar3 < iVar6);
      break;
    case GREATER:
      this_local = (CmdLogic *)operator_new(0x10);
      ObjectBool::ObjectBool((ObjectBool *)this_local,iVar6 < iVar3);
      break;
    case LESSER_EQUALS:
      this_local = (CmdLogic *)operator_new(0x10);
      ObjectBool::ObjectBool((ObjectBool *)this_local,iVar3 <= iVar6);
      break;
    case GREATER_EQUALS:
      this_local = (CmdLogic *)operator_new(0x10);
      ObjectBool::ObjectBool((ObjectBool *)this_local,iVar6 <= iVar3);
      break;
    default:
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar8,"CmdLogic::execute => unknown operation!");
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    return (Object *)this_local;
  }
  prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar8,"CmdLogic::execute => can\'t compare different types!");
  __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Object *CmdLogic::execute(Engine *engine) {
	Object* object1 = getPureObject(left->execute(engine));
	Object* object2 = getPureObject(right->execute(engine));
	ObjectType type1 = object1->getType();
	ObjectType type2 = object2->getType();
	
	switch (this->operation) {
		case EQUALS:
			if (type1 == type2) {
				switch (type1) {
					case OT_BOOL:
						return new ObjectBool(getBoolOrCrash(object1) == getBoolOrCrash(object2));
					case OT_INT:
						return new ObjectBool(getIntOrCrash(object1) == getIntOrCrash(object2));
				}
			} else {
				return new ObjectBool(false);
			}
			break;
		case NOTEQUALS:
			if (type1 == type2) {
				switch (type1) {
					case OT_BOOL:
						return new ObjectBool(getBoolOrCrash(object1) != getBoolOrCrash(object2));
					case OT_INT:
						return new ObjectBool(getIntOrCrash(object1) != getIntOrCrash(object2));
				}
			} else {
				return new ObjectBool(true);
			}
			break;
		default:
			break;
	}
	if (type1 == OT_INT && type2 == OT_INT) {
		int x1 = getIntOrCrash(object1);
		int x2 = getIntOrCrash(object2);
		switch (this->operation) {
			case LESSER:
				return new ObjectBool(x1 < x2);
			case GREATER:
				return new ObjectBool(x1 > x2);
			case LESSER_EQUALS:
				return new ObjectBool(x1 <= x2);
			case GREATER_EQUALS:
				return new ObjectBool(x1 >= x2);
			default:
				throw std::runtime_error("CmdLogic::execute => unknown operation!");
		}
	} else {
		throw std::runtime_error("CmdLogic::execute => can't compare different types!");
	}
}